

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::flags_internal::anon_unknown_6::RetiredFlagObj::OnAccess(RetiredFlagObj *this)

{
  undefined1 local_b8 [40];
  char *local_90;
  undefined8 local_68;
  char *local_60;
  AlphaNum local_38;
  
  local_b8[0x20] = '\x18';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_90 = "Accessing retired flag \'";
  if (this == (RetiredFlagObj *)0x0) {
    local_38.piece_._M_len = 0;
  }
  else {
    local_38.piece_._M_len = strlen((char *)this);
  }
  local_68 = 1;
  local_60 = "\'";
  local_38.piece_._M_str = (char *)this;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_b8,(AlphaNum *)(local_b8 + 0x20),&local_38);
  absl::lts_20240722::flags_internal::ReportUsageError(local_b8._8_8_,local_b8._0_8_,0);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  return;
}

Assistant:

void OnAccess() const {
    flags_internal::ReportUsageError(
        absl::StrCat("Accessing retired flag '", name_, "'"), false);
  }